

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeFindTrees_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iObj,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_64;
  int Out;
  int In;
  Vec_Bit_t *vFound_local;
  Vec_Int_t *vTree_local;
  int Rank_local;
  int iObj_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vAdds_local;
  
  iVar1 = Abc_Var2Lit(iObj,1);
  iVar1 = Vec_IntEntry(vMap,iVar1);
  iVar2 = Abc_Var2Lit(iObj,0);
  iVar2 = Vec_IntEntry(vMap,iVar2);
  if ((-1 < iVar1) && (-1 < iVar2)) {
    iVar3 = Acec_TreeWhichPoint(vAdds,iVar1,iObj);
    local_64 = Rank;
    if (iVar3 == 4) {
      local_64 = Rank + -1;
    }
    Acec_TreeFindTrees2_rec(vAdds,vMap,iVar1,local_64,vTree,vFound);
    Acec_TreeFindTrees2_rec(vAdds,vMap,iVar2,Rank,vTree,vFound);
  }
  return;
}

Assistant:

void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    int In  = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 1) );
    int Out = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 0) );
    if ( In < 0 || Out < 0 )
        return;
    Acec_TreeFindTrees2_rec( vAdds, vMap, In,  Acec_TreeWhichPoint(vAdds, In, iObj) == 4 ? Rank-1 : Rank, vTree, vFound );
    Acec_TreeFindTrees2_rec( vAdds, vMap, Out, Rank, vTree, vFound );
}